

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O3

void __thiscall libtorrent::create_torrent::create_torrent(create_torrent *this,torrent_info *ti)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  sha256_hash *this_00;
  char *pcVar2;
  byte bVar3;
  pointer pcVar4;
  pointer ppVar5;
  pointer paVar6;
  pointer pwVar7;
  pointer pcVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  time_t tVar12;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar13;
  ulong uVar14;
  char *pcVar15;
  vector<char,std::allocator<char>> *pvVar16;
  diff_type piece;
  pointer ppVar17;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar18;
  file_index_t index;
  announce_entry *t;
  pointer paVar19;
  pointer pwVar20;
  ulong uVar21;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  piece_index_t index_00;
  long lVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  string_view url;
  span<const_char> sVar25;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  pointer local_78;
  uint auStack_70 [2];
  string *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  
  anon_unknown_40::convert_file_storage
            ((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
              *)local_88,&ti->m_files);
  (this->m_files).
  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_88;
  (this->m_files).
  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = uStack_80;
  (this->m_files).
  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
  local_88 = (undefined1  [8])0x0;
  uStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
  ~vector((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *)
          local_88);
  this->m_total_size = (ti->m_files).m_total_size;
  iVar11 = (ti->m_files).m_num_pieces;
  this->m_piece_length = (ti->m_files).m_piece_length;
  this->m_num_pieces = iVar11;
  paVar1 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (ti->m_files).m_name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar4,pcVar4 + (ti->m_files).m_name._M_string_length);
  local_68 = &this->m_name;
  local_60 = paVar1;
  entry::entry(&this->m_info_dict);
  (this->m_file_storage_compat).super__Optional_base<libtorrent::file_storage,_false,_false>.
  _M_payload.super__Optional_payload<libtorrent::file_storage,_true,_false,_false>.
  super__Optional_payload_base<libtorrent::file_storage>._M_engaged = false;
  (this->m_urls).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_urls).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_urls).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_url_seeds).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_url_seeds).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_url_seeds).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_piece_hash).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_piece_hash).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_piece_hash).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_filehashes).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_filehashes).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_filehashes).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_file_piece_hash).
  super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  .
  super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_file_piece_hash).
  super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  .
  super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_file_piece_hash).
  super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  .
  super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_similar).
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_similar).
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_similar).
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_collections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_collections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_collections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tVar12 = time((time_t *)0x0);
  this->m_creation_date = tVar12;
  (this->m_comment)._M_dataplus._M_p = (pointer)&(this->m_comment).field_2;
  (this->m_comment)._M_string_length = 0;
  (this->m_comment).field_2._M_local_buf[0] = '\0';
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  (this->m_created_by)._M_string_length = 0;
  (this->m_created_by).field_2._M_local_buf[0] = '\0';
  (this->m_root_cert)._M_dataplus._M_p = (pointer)&(this->m_root_cert).field_2;
  (this->m_root_cert)._M_string_length = 0;
  (this->m_root_cert).field_2._M_local_buf[0] = '\0';
  iVar11 = file_storage::num_files(&ti->m_files);
  bVar3 = this->field_0x258;
  this->field_0x258 = bVar3 & 0xfe | 1 < iVar11;
  this->field_0x258 = bVar3 & 0xf0 | 1 < iVar11 | (ti->m_flags).m_val & 2;
  bVar9 = digest32<160L>::is_all_zeros(&(ti->m_info_hash).v1);
  this->field_0x258 = this->field_0x258 & 0xef | bVar9 << 4;
  this_00 = &(ti->m_info_hash).v2;
  bVar9 = digest32<256L>::is_all_zeros(this_00);
  this->field_0x258 = this->field_0x258 & 0xdf | bVar9 << 5;
  bVar9 = digest32<160L>::is_all_zeros(&(ti->m_info_hash).v1);
  bVar10 = digest32<256L>::is_all_zeros(this_00);
  if (0 < (ti->m_files).m_piece_length) {
    if (0 < ti->m_creation_date) {
      this->m_creation_date = ti->m_creation_date;
    }
    if ((ti->m_created_by)._M_string_length != 0) {
      set_creator(this,(ti->m_created_by)._M_dataplus._M_p);
    }
    if ((ti->m_comment)._M_string_length != 0) {
      set_comment(this,(ti->m_comment)._M_dataplus._M_p);
    }
    ppVar17 = (ti->m_nodes).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (ti->m_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar17 != ppVar5) {
      paVar1 = &local_58.first.field_2;
      do {
        pcVar4 = (ppVar17->first)._M_dataplus._M_p;
        local_58.first._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar4,pcVar4 + (ppVar17->first)._M_string_length);
        local_58.second = ppVar17->second;
        ::std::
        vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
        ::emplace_back<std::pair<std::__cxx11::string,int>>
                  ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                    *)&this->m_nodes,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_58.first._M_dataplus._M_p,
                          local_58.first.field_2._M_allocated_capacity + 1);
        }
        ppVar17 = ppVar17 + 1;
      } while (ppVar17 != ppVar5);
    }
    paVar6 = (ti->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             .
             super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (paVar19 = (ti->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   .
                   super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start; paVar19 != paVar6;
        paVar19 = paVar19 + 1) {
      url._M_str = (paVar19->url)._M_dataplus._M_p;
      url._M_len = (paVar19->url)._M_string_length;
      add_tracker(this,url,(uint)paVar19->tier);
    }
    pwVar20 = (ti->m_web_seeds).
              super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pwVar7 = (ti->m_web_seeds).
             super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pwVar20 != pwVar7) {
      do {
        uStack_80 = (pointer)(pwVar20->url)._M_dataplus._M_p;
        local_88 = (undefined1  [8])(pwVar20->url)._M_string_length;
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->m_url_seeds,(basic_string_view<char,_std::char_traits<char>_> *)local_88);
        pwVar20 = pwVar20 + 1;
      } while (pwVar20 != pwVar7);
    }
    if (!bVar9) {
      ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
      resize(&(this->m_piece_hash).
              super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
             ,(long)(ti->m_files).m_num_pieces);
      iVar13 = file_storage::piece_range(&ti->m_files);
      sVar18 = iVar13._end.m_val;
      if (iVar13._begin.m_val.m_val != sVar18.m_val) {
        do {
          index_00.m_val = (int)iVar13._begin.m_val;
          torrent_info::hash_for_piece((sha1_hash *)local_88,ti,index_00);
          set_hash(this,index_00,(sha1_hash *)local_88);
          iVar13._begin.m_val = index_00.m_val + 1;
          iVar13._end.m_val = 0;
        } while (sVar18.m_val != iVar13._begin.m_val);
      }
    }
    if (!bVar10) {
      ::std::
      vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
      ::resize(&(this->m_file_piece_hash).
                super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
               ,((long)(this->m_files).
                       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       .
                       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_files).
                       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       .
                       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3);
      uVar14 = ((long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      if ((int)uVar14 != 0) {
        uVar21 = 0;
        do {
          pcVar8 = (this->m_files).
                   super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                   .
                   super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((((file_flags_t *)((long)(pcVar8 + uVar21) + 0x28))->m_val & 1) == 0) &&
             (lVar22 = *(int64_t *)((long)(pcVar8 + uVar21) + 0x20), lVar22 != 0)) {
            index.m_val = (int)uVar21;
            if (this->m_piece_length < lVar22) {
              sVar25 = torrent_info::piece_layer(ti,index);
              pcVar15 = sVar25.m_ptr;
              if (0 < (int)sVar25.m_len) {
                lVar22 = 0;
                piece.m_val = 0;
                do {
                  if (pcVar15 == (char *)0x0) {
                    local_88._0_4_ = 0;
                    local_88._4_4_ = 0;
                    uVar23 = 0;
                    uVar24 = 0;
                    local_78 = (pointer)0x0;
                    auStack_70[0] = 0;
                    auStack_70[1] = 0;
                  }
                  else {
                    pcVar2 = pcVar15 + lVar22;
                    local_88._0_4_ = *(undefined4 *)pcVar2;
                    local_88._4_4_ = *(undefined4 *)(pcVar2 + 4);
                    uVar23 = *(undefined4 *)(pcVar2 + 8);
                    uVar24 = *(undefined4 *)(pcVar2 + 0xc);
                    local_78 = *(pointer *)(pcVar15 + lVar22 + 0x10);
                    auStack_70 = *(uint (*) [2])(pcVar15 + lVar22 + 0x10 + 8);
                  }
                  uStack_80 = (pointer)CONCAT44(uVar24,uVar23);
                  set_hash2(this,index,piece,(sha256_hash *)local_88);
                  lVar22 = lVar22 + 0x20;
                  piece.m_val = piece.m_val + 1;
                } while ((int)lVar22 < (int)sVar25.m_len);
              }
            }
            else {
              file_storage::root((sha256_hash *)local_88,&ti->m_files,index);
              set_hash2(this,index,(diff_type)0x0,(sha256_hash *)local_88);
            }
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != (uVar14 & 0xffffffff));
      }
    }
    pcVar15 = (ti->m_info_section).px;
    iVar11 = ti->m_info_section_size;
    pvVar16 = (vector<char,std::allocator<char>> *)entry::preformatted(&this->m_info_dict);
    ::std::vector<char,std::allocator<char>>::_M_assign_aux<char_const*>
              (pvVar16,pcVar15,pcVar15 + iVar11);
  }
  return;
}

Assistant:

create_torrent::create_torrent(torrent_info const& ti)
		: m_files(convert_file_storage(ti.files()))
		, m_total_size(ti.total_size())
		, m_piece_length(ti.piece_length())
		, m_num_pieces(ti.num_pieces())
		, m_name(ti.name())
		, m_creation_date(::time(nullptr))
		, m_multifile(ti.num_files() > 1)
		, m_private(ti.priv())
		, m_include_mtime(false)
		, m_include_symlinks(false)
		, m_v2_only(!ti.info_hashes().has_v1())
		, m_v1_only(!ti.info_hashes().has_v2())
	{
		bool const make_v1 = ti.info_hashes().has_v1();
		bool const make_v2 = ti.info_hashes().has_v2();

		TORRENT_ASSERT_PRECOND(make_v2 || make_v1);
		TORRENT_ASSERT_PRECOND(ti.is_valid());
		TORRENT_ASSERT_PRECOND(ti.num_pieces() > 0);
		TORRENT_ASSERT_PRECOND(ti.num_files() > 0);
		TORRENT_ASSERT_PRECOND(ti.total_size() > 0);

		if (!ti.is_valid()) return;
		if (ti.creation_date() > 0) m_creation_date = ti.creation_date();

		if (!ti.creator().empty()) set_creator(ti.creator().c_str());
		if (!ti.comment().empty()) set_comment(ti.comment().c_str());

		for (auto const& n : ti.nodes())
			add_node(n);

		for (auto const& t : ti.trackers())
			add_tracker(t.url, t.tier);

		for (auto const& s : ti.web_seeds())
			add_url_seed(s.url);

		if (make_v1)
		{
			m_piece_hash.resize(ti.num_pieces());
			for (auto const i : ti.piece_range())
				set_hash(i, ti.hash_for_piece(i));
		}

		if (make_v2)
		{
			m_file_piece_hash.resize(m_files.size());
			for (auto const i : file_range())
			{
				// don't include merkle hash trees for pad files
				if (m_files[i].flags & file_storage::flag_pad_file) continue;
				if (m_files[i].size == 0) continue;

				auto const file_size = m_files[i].size;
				if (file_size <= m_piece_length)
				{
					set_hash2(i, piece_index_t::diff_type{0}, ti.files().root(i));
					continue;
				}

				span<char const> pieces = ti.piece_layer(i);

				piece_index_t::diff_type p{0};
				for (int h = 0; h < int(pieces.size()); h += int(sha256_hash::size()))
					set_hash2(i, p++, sha256_hash(pieces.data() + h));
			}
		}

		auto const info = ti.info_section();
		m_info_dict.preformatted().assign(info.data(), info.data() + info.size());
	}